

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_0::ShutdownRepeatedFieldAccessor(void)

{
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>_>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>::ShutDown();
  Singleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>::ShutDown();
  Singleton<google::protobuf::internal::MapFieldAccessor>::ShutDown();
  return;
}

Assistant:

void ShutdownRepeatedFieldAccessor() {
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<int32> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<uint32> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<int64> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<uint64> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<float> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<double> >::ShutDown();
  internal::Singleton<internal::RepeatedFieldPrimitiveAccessor<bool> >::ShutDown();
  internal::Singleton<internal::RepeatedPtrFieldStringAccessor>::ShutDown();
  internal::Singleton<internal::RepeatedPtrFieldMessageAccessor>::ShutDown();
  internal::Singleton<internal::MapFieldAccessor>::ShutDown();
}